

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RBTree.h
# Opt level: O2

RBTree<int> * __thiscall
BinTrees::RBTree<int>::gen(RBTree<int> *this,initializer_list<int> l,int *sum)

{
  BinSTree<int> *pBVar1;
  int iVar2;
  int iVar3;
  RBTree<int> *this_00;
  BinSTree<int> *this_01;
  int *piVar4;
  int iVar5;
  
  piVar4 = (int *)l._M_len;
  *piVar4 = 0;
  this_00 = (RBTree<int> *)operator_new(0x28);
  iVar5 = (this->super_BinSTree<int>).super_BinTree<int>.v;
  (this_00->super_BinSTree<int>).super_BinTree<int>.v = iVar5;
  pBVar1 = &this->super_BinSTree<int>;
  *(undefined8 *)((long)&(this_00->super_BinSTree<int>).super_BinTree<int>.r + 1) = 0;
  *(undefined8 *)((long)&(this_00->super_BinSTree<int>).super_BinTree<int>.p + 1) = 0;
  (this_00->super_BinSTree<int>).super_BinTree<int>.l = (BinTree<int> *)0x0;
  (this_00->super_BinSTree<int>).super_BinTree<int>.r = (BinTree<int> *)0x0;
  while( true ) {
    this = (RBTree<int> *)&(this->super_BinSTree<int>).super_BinTree<int>.field_0x4;
    *piVar4 = iVar5;
    if (&(pBVar1->super_BinTree<int>).v + (long)l._M_array <= this) break;
    this_00 = i<int_const&>(this_00,(int *)this);
    this_01 = BinSTree<int>::search(&this_00->super_BinSTree<int>,(int *)this);
    iVar2 = BinSTree<int>::suc(this_01);
    iVar5 = (this_01->super_BinTree<int>).v;
    iVar2 = iVar2 - iVar5;
    iVar3 = BinSTree<int>::pre(this_01);
    iVar5 = iVar5 - iVar3;
    if (iVar2 <= iVar5) {
      iVar5 = iVar2;
    }
    iVar5 = iVar5 + *piVar4;
  }
  return this_00;
}

Assistant:

RBTree<T> *RBTree<T>::gen(std::initializer_list<T> l, T &sum) {
        sum = 0;
        auto t = new RBTree<T>(*(l.begin()));
        const BinTrees::BinSTree<int> *p = t;
        sum += *(l.begin());
        auto i = l.begin() + 1;
        for (i; i < l.end(); i++) {
            t = t->i(*i);
            p = &(t->search(*i));
            sum += std::min(p->suc() - p->V(), p->V() - p->pre());
        }
        return t;
    }